

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void aom_highbd_dc_predictor_32x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 in_RCX;
  ptrdiff_t in_RDX;
  uint16_t *in_RSI;
  undefined4 in_R8D;
  int unaff_retaddr;
  int in_stack_00000008;
  uint32_t in_stack_00000010;
  uint16_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  highbd_dc_predictor_rect
            (in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
             (uint16_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
             unaff_retaddr,in_stack_00000008,in_stack_00000010);
  return;
}

Assistant:

void aom_highbd_dc_predictor_32x16_c(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  highbd_dc_predictor_rect(dst, stride, 32, 16, above, left, bd, 4,
                           HIGHBD_DC_MULTIPLIER_1X2);
}